

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbsptree.cpp
# Opt level: O3

int __thiscall QBspTree::init(QBspTree *this,EVP_PKEY_CTX *ctx)

{
  pointer pNVar1;
  int *piVar2;
  Type in_ECX;
  uint in_EDX;
  int iVar3;
  Type TVar4;
  int in_R8D;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  TVar4 = (in_EDX & 1) + VerticalPlane;
  if (in_ECX != Both) {
    TVar4 = in_ECX;
  }
  iVar3 = (int)((ulong)(((long)*(int *)(ctx + 0xc) + (long)*(int *)(ctx + 4)) -
                       ((long)*(int *)(ctx + 0xc) + (long)*(int *)(ctx + 4) >> 0x3f)) >> 1);
  iVar5 = (int)((ulong)(((long)*(int *)(ctx + 8) + (long)*(int *)ctx) -
                       ((long)*(int *)(ctx + 8) + (long)*(int *)ctx >> 0x3f)) >> 1);
  iVar6 = iVar3;
  if (TVar4 == VerticalPlane) {
    iVar6 = iVar5;
  }
  pNVar1 = QList<QBspTree::Node>::data(&this->nodes);
  pNVar1[in_R8D].pos = iVar6;
  pNVar1 = QList<QBspTree::Node>::data(&this->nodes);
  pNVar1[in_R8D].type = TVar4;
  uStack_40 = *(undefined8 *)(ctx + 8);
  local_58 = *(undefined4 *)ctx;
  uStack_54 = *(undefined4 *)(ctx + 4);
  iStack_50 = *(int *)(ctx + 8);
  iStack_4c = *(int *)(ctx + 0xc);
  if (TVar4 == VerticalPlane) {
    piVar2 = &iStack_50;
    _local_48 = CONCAT44((int)((ulong)*(undefined8 *)ctx >> 0x20),iVar5);
    iVar3 = iVar5;
  }
  else {
    piVar2 = &iStack_4c;
    _local_48 = CONCAT44(iVar3,(int)*(undefined8 *)ctx);
  }
  *piVar2 = iVar3 + -1;
  if (in_EDX != 1) {
    init(this,(EVP_PKEY_CTX *)&local_58);
    init(this,(EVP_PKEY_CTX *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QBspTree::init(const QRect &area, int depth, NodeType type, int index)
{
    Node::Type t = Node::None; // t should never have this value
    if (type == Node::Both) // if both planes are specified, use 2d bsp
        t = (depth & 1) ? Node::HorizontalPlane : Node::VerticalPlane;
    else
        t = type;
    QPoint center = area.center();
    nodes[index].pos = (t == Node::VerticalPlane ? center.x() : center.y());
    nodes[index].type = t;

    QRect front = area;
    QRect back = area;

    if (t == Node::VerticalPlane) {
        front.setLeft(center.x());
        back.setRight(center.x() - 1); // front includes the center
    } else { // t == Node::HorizontalPlane
        front.setTop(center.y());
        back.setBottom(center.y() - 1);
    }

    int idx = firstChildIndex(index);
    if (--depth) {
        init(back, depth, type, idx);
        init(front, depth, type, idx + 1);
    }
}